

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::mouseMoveEvent(QLineEdit *this,QMouseEvent *e)

{
  QLineEditPrivate *this_00;
  bool bVar1;
  LayoutDirection LVar2;
  int iVar3;
  QPoint QVar4;
  int iVar5;
  int iVar6;
  QWidgetLineControl *pQVar7;
  long in_FS_OFFSET;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) goto LAB_003ec8f6;
  if ((this_00->dndTimer).m_id != Invalid) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint(&local_38);
    iVar5 = (this_00->mousePressPos).xp.m_i - QVar4.xp.m_i;
    iVar6 = (this_00->mousePressPos).yp.m_i - QVar4.yp.m_i;
    iVar3 = -iVar5;
    if (0 < iVar5) {
      iVar3 = iVar5;
    }
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = QApplication::startDragDistance();
    if (iVar6 < iVar5 + iVar3) {
      QLineEditPrivate::drag(this_00);
    }
    goto LAB_003ec8f6;
  }
  if (0 < this_00->mouseYThreshold) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint(&local_38);
    if ((this_00->mousePressPos).yp.m_i + this_00->mouseYThreshold < QVar4.yp.m_i.m_i) {
      LVar2 = QWidget::layoutDirection(&this->super_QWidget);
      pQVar7 = this_00->control;
      if (LVar2 != RightToLeft) {
LAB_003ec852:
        QWidgetLineControl::end((QWidgetLineControl *)pQVar7,true);
        goto LAB_003ec8f6;
      }
LAB_003ec800:
      QWidgetLineControl::home((QWidgetLineControl *)pQVar7,true);
      goto LAB_003ec8f6;
    }
    if (0 < this_00->mouseYThreshold) {
      local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
      QVar4 = QPointF::toPoint(&local_38);
      if (QVar4.yp.m_i.m_i + this_00->mouseYThreshold < (this_00->mousePressPos).yp.m_i) {
        LVar2 = QWidget::layoutDirection(&this->super_QWidget);
        pQVar7 = this_00->control;
        if (LVar2 == RightToLeft) goto LAB_003ec852;
        goto LAB_003ec800;
      }
    }
  }
  bVar1 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
  if (bVar1) {
    iVar3 = QLineEditPrivate::xToPos
                      (this_00,(this_00->mousePressPos).xp.m_i,CursorBetweenCharacters);
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint(&local_38);
    iVar5 = QLineEditPrivate::xToPos(this_00,QVar4.xp.m_i.m_i,CursorBetweenCharacters);
    if (iVar5 - iVar3 != 0) {
      QWidgetLineControl::setSelection((QWidgetLineControl *)this_00->control,iVar3,iVar5 - iVar3);
    }
  }
  else {
    pQVar7 = this_00->control;
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    QVar4 = QPointF::toPoint(&local_38);
    iVar3 = QLineEditPrivate::xToPos(this_00,QVar4.xp.m_i.m_i,CursorBetweenCharacters);
    QWidgetLineControl::moveCursor((QWidgetLineControl *)pQVar7,iVar3,true);
  }
LAB_003ec8f6:
  QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QLineEdit);

    if (e->buttons() & Qt::LeftButton) {
#if QT_CONFIG(draganddrop)
        if (d->dndTimer.isActive()) {
            if ((d->mousePressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance())
                d->drag();
        } else
#endif
        {
#ifndef Q_OS_ANDROID
            const bool select = true;
#else
            const bool select = (d->imHints & Qt::ImhNoPredictiveText);
#endif
#ifndef QT_NO_IM
            if (d->mouseYThreshold > 0 && e->position().toPoint().y() > d->mousePressPos.y() + d->mouseYThreshold) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->home(select);
                else
                    d->control->end(select);
            } else if (d->mouseYThreshold > 0 && e->position().toPoint().y() + d->mouseYThreshold < d->mousePressPos.y()) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->end(select);
                else
                    d->control->home(select);
            } else if (d->control->composeMode() && select) {
                int startPos = d->xToPos(d->mousePressPos.x());
                int currentPos = d->xToPos(e->position().toPoint().x());
                if (startPos != currentPos)
                    d->control->setSelection(startPos, currentPos - startPos);

            } else
#endif
            {
                d->control->moveCursor(d->xToPos(e->position().toPoint().x()), select);
            }
        }
    }

    d->sendMouseEventToInputContext(e);
}